

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

bool __thiscall
glcts::GeometryShaderMaxInvocationsTest::verifyResultOfSingleInvocationPass
          (GeometryShaderMaxInvocationsTest *this,uchar *result_image)

{
  GLint *value;
  ostringstream *poVar1;
  bool bVar2;
  MessageBuilder *pMVar3;
  uint x;
  uint uVar4;
  uint uVar5;
  undefined1 local_1b0 [384];
  
  bVar2 = TestCaseBase::comparePixel
                    (&this->super_TestCaseBase,result_image,2,5,this->m_texture_width,9,4,'\0',0xff,
                     '\0','\0');
  if (bVar2) {
    bVar2 = TestCaseBase::comparePixel
                      (&this->super_TestCaseBase,result_image,8,8,this->m_texture_width,9,4,0xff,
                       '\0','\0','\0');
    if (bVar2) {
      value = &this->m_max_geometry_shader_invocations;
      uVar4 = 1;
      uVar5 = 0x23;
      x = 0x11;
      while( true ) {
        if ((uint)*value <= uVar4) {
          return true;
        }
        bVar2 = TestCaseBase::comparePixel
                          (&this->super_TestCaseBase,result_image,uVar5 / 3,5,this->m_texture_width,
                           9,4,0xff,'\0','\0','\0');
        if (!bVar2) break;
        bVar2 = TestCaseBase::comparePixel
                          (&this->super_TestCaseBase,result_image,x,8,this->m_texture_width,9,4,0xff
                           ,'\0','\0','\0');
        if (!bVar2) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Invalid pixel at [");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,";");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,"]! Background for index: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1," from range <0:");
          pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00ced371;
        }
        uVar4 = uVar4 + 1;
        uVar5 = uVar5 + 0x1b;
        x = x + 9;
      }
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid pixel at [");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,";");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"]! Triangle index: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," from range <0:");
      pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid pixel at [");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,";");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"]! Background for index: ");
      std::ostream::operator<<(poVar1,0);
      std::operator<<((ostream *)poVar1," from range <0:");
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&this->m_max_geometry_shader_invocations);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid pixel at [");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,";");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,"]! Triangle index: ");
    std::ostream::operator<<(poVar1,0);
    std::operator<<((ostream *)poVar1," from range <0:");
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_max_geometry_shader_invocations);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
LAB_00ced371:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool GeometryShaderMaxInvocationsTest::verifyResultOfSingleInvocationPass(unsigned char* result_image)
{
	/* Only one triangle should be drawn, verify that pixel at its center was modified */
	{
		const unsigned int x1 = 0;
		const unsigned int x2 = 0;
		const unsigned int x3 = m_triangle_edge_length - 1;

		const unsigned int y1 = 0;
		const unsigned int y2 = m_triangle_edge_length - 1;
		const unsigned int y3 = m_triangle_edge_length - 1;

		const unsigned int center_x = (x1 + x2 + x3) / 3;
		const unsigned int center_y = (y1 + y2 + y3) / 3;

		bool is_pixel_valid = comparePixel(result_image, center_x, center_y, m_texture_width, m_texture_height,
										   m_texture_pixel_size, 0, 255, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << center_x << ";" << center_y
							   << "]! "
								  "Triangle index: "
							   << 0 << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}

		/* Verify that background's pixel was not modified */
		const unsigned int x4 = m_triangle_edge_length - 1;
		const unsigned int y4 = m_triangle_edge_length - 1;

		is_pixel_valid =
			comparePixel(result_image, x4, y4, m_texture_width, m_texture_height, m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << x4 << ";" << y4
							   << "]! "
								  "Background for index: "
							   << 0 << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	for (unsigned int i = 1; i < (unsigned int)m_max_geometry_shader_invocations; ++i)
	{
		/* Verify that pixel at triangle's center was not modified */
		const unsigned int x1 = m_triangle_edge_length * i;
		const unsigned int x2 = m_triangle_edge_length * i;
		const unsigned int x3 = m_triangle_edge_length * (i + 1) - 1;

		const unsigned int y1 = 0;
		const unsigned int y2 = m_triangle_edge_length - 1;
		const unsigned int y3 = m_triangle_edge_length - 1;

		const unsigned int center_x = (x1 + x2 + x3) / 3;
		const unsigned int center_y = (y1 + y2 + y3) / 3;

		bool is_pixel_valid = comparePixel(result_image, center_x, center_y, m_texture_width, m_texture_height,
										   m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << center_x << ";" << center_y
							   << "]! "
								  "Triangle index: "
							   << i << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}

		/* Verify that background's pixel was not modified */
		const unsigned int x4 = m_triangle_edge_length * (i + 1) - 1;
		const unsigned int y4 = m_triangle_edge_length - 1;

		is_pixel_valid =
			comparePixel(result_image, x4, y4, m_texture_width, m_texture_height, m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << x4 << ";" << y4
							   << "]! "
								  "Background for index: "
							   << i << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}